

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devexpricing.hpp
# Opt level: O3

HighsInt __thiscall DevexPricing::chooseconstrainttodrop(DevexPricing *this,QpVector *lambda)

{
  double *pdVar1;
  double dVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  vector<int,_std::allocator<int>_> active_constraint_index;
  vector<int,_std::allocator<int>_> constraintindexinbasisfactor;
  HighsInt local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  vector<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_78,&this->basis->active_constraint_index);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,&this->basis->constraintindexinbasisfactor);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_80 = -1;
  }
  else {
    local_80 = -1;
    uVar4 = 0;
    local_60 = 0.0;
    do {
      lVar5 = (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4]];
      if (lVar5 == -1) {
        puts("error");
      }
      dVar2 = (lambda->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      dVar6 = (dVar2 * dVar2) /
              (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      if ((local_60 < dVar6) &&
         (pdVar1 = &(this->runtime->settings).lambda_zero_threshold,
         *pdVar1 <= ABS(dVar2) && ABS(dVar2) != *pdVar1)) {
        uStack_50 = 0;
        local_7c = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4];
        local_58 = dVar6;
        pmVar3 = std::
                 map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
                 ::operator[](&this->basis->basisstatus,&local_7c);
        if ((*pmVar3 != kActiveAtLower) ||
           (pdVar1 = (lambda->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar5, 0.0 < *pdVar1 || *pdVar1 == 0.0)) {
          local_7c = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4];
          pmVar3 = std::
                   map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
                   ::operator[](&this->basis->basisstatus,&local_7c);
          if ((*pmVar3 != kActiveAtUpper) ||
             ((lambda->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5] <= 0.0)) goto LAB_00337139;
        }
        local_80 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4];
        local_60 = local_58;
      }
LAB_00337139:
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_80;
}

Assistant:

HighsInt chooseconstrainttodrop(const QpVector& lambda) {
    auto active_constraint_index = basis.getactive();
    auto constraintindexinbasisfactor = basis.getindexinfactor();

    HighsInt minidx = -1;
    double maxabslambda = 0.0;
    for (size_t i = 0; i < active_constraint_index.size(); i++) {
      HighsInt indexinbasis =
          constraintindexinbasisfactor[active_constraint_index[i]];
      if (indexinbasis == -1) {
        printf("error\n");
      }
      assert(indexinbasis != -1);

      double val = lambda.value[indexinbasis] * lambda.value[indexinbasis] /
                   weights[indexinbasis];
      if (val > maxabslambda && fabs(lambda.value[indexinbasis]) >
                                    runtime.settings.lambda_zero_threshold) {
        if (basis.getstatus(active_constraint_index[i]) ==
                BasisStatus::kActiveAtLower &&
            -lambda.value[indexinbasis] > 0) {
          minidx = active_constraint_index[i];
          maxabslambda = val;
        } else if (basis.getstatus(active_constraint_index[i]) ==
                       BasisStatus::kActiveAtUpper &&
                   lambda.value[indexinbasis] > 0) {
          minidx = active_constraint_index[i];
          maxabslambda = val;
        } else {
          // TODO
        }
      }
    }

    return minidx;
  }